

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_159f6cf::EncodeAPI_AomediaIssue3509VbrMinSection101Percent_Test::TestBody
          (EncodeAPI_AomediaIssue3509VbrMinSection101Percent_Test *this)

{
  undefined8 *puVar1;
  aom_codec_err_t aVar2;
  aom_codec_iface_t *iface;
  uint h;
  uint extraout_EDX;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  SEARCH_METHODS *pSVar4;
  AssertionResult AVar5;
  aom_image_t *image;
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3f8;
  AssertHelper local_3f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3e8;
  internal local_3e0 [8];
  undefined8 *local_3d8;
  aom_codec_ctx_t local_3d0;
  aom_codec_enc_cfg_t local_398;
  
  iface = aom_codec_av1_cx();
  local_3e8._M_head_impl._0_4_ = aom_codec_enc_config_default(iface,&local_398,1);
  local_3f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_3f8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            (local_3e0,"aom_codec_enc_config_default(iface, &cfg, 1u)","AOM_CODEC_OK",
             (aom_codec_err_t *)&local_3e8,(aom_codec_err_t *)&local_3f8);
  puVar1 = local_3d8;
  if (local_3e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3e8);
    if (local_3d8 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_3d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_api_test.cc"
               ,0x344,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)&local_3e8);
LAB_00624a94:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    _Var3._M_head_impl = local_3e8._M_head_impl;
  }
  else {
    if (local_3d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3d8 != local_3d8 + 2) {
        operator_delete((undefined8 *)*local_3d8);
      }
      operator_delete(puVar1);
    }
    local_398.g_w = 0x780;
    local_398.g_h = 0x438;
    local_398.rc_target_bitrate = 1000000;
    local_398.rc_2pass_vbr_minsection_pct = 0x65;
    aVar2 = aom_codec_enc_init_ver(&local_3d0,iface,&local_398,0,0x1d);
    local_3e8._M_head_impl._0_4_ = aVar2;
    local_3f8._M_head_impl = local_3f8._M_head_impl & 0xffffffff00000000;
    AVar5 = testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                      (local_3e0,
                       "aom_codec_enc_init_ver(&enc, iface, &cfg, 0, (10 + (7 + (9)) + 3))",
                       "AOM_CODEC_OK",(aom_codec_err_t *)&local_3e8,(aom_codec_err_t *)&local_3f8);
    puVar1 = local_3d8;
    h = (uint)AVar5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    if (local_3e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3e8);
      if (local_3d8 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_3d8;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_api_test.cc"
                 ,0x34e,(char *)pSVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)&local_3e8);
      goto LAB_00624a94;
    }
    if (local_3d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3d8 != local_3d8 + 2) {
        operator_delete((undefined8 *)*local_3d8);
      }
      operator_delete(puVar1);
      h = extraout_EDX;
    }
    local_3e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CreateGrayImage(local_398.g_w,local_398.g_h,h);
    local_3f8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<aom_image*,decltype(nullptr)>
              (local_3e0,"image","nullptr",(aom_image **)&local_3e8,&local_3f8._M_head_impl);
    puVar1 = local_3d8;
    if (local_3e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3f8);
      if (local_3d8 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_3d8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_api_test.cc"
                 ,0x353,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_3f8);
    }
    else {
      if (local_3d8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_3d8 != local_3d8 + 2) {
          operator_delete((undefined8 *)*local_3d8);
        }
        operator_delete(puVar1);
      }
      aVar2 = aom_codec_encode(&local_3d0,(aom_image_t *)local_3e8._M_head_impl,0,300,0);
      local_3f8._M_head_impl._0_4_ = aVar2;
      local_3f0.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                (local_3e0,"aom_codec_encode(&enc, image, 0, 300, 0)","AOM_CODEC_OK",
                 (aom_codec_err_t *)&local_3f8,(aom_codec_err_t *)&local_3f0);
      puVar1 = local_3d8;
      if (local_3e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_3f8);
        if (local_3d8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_3d8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_api_test.cc"
                   ,0x359,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_3f8);
      }
      else {
        if (local_3d8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_3d8 != local_3d8 + 2) {
            operator_delete((undefined8 *)*local_3d8);
          }
          operator_delete(puVar1);
        }
        aom_img_free((aom_image_t *)local_3e8._M_head_impl);
        aVar2 = aom_codec_destroy(&local_3d0);
        local_3f8._M_head_impl._0_4_ = aVar2;
        local_3f0.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  (local_3e0,"aom_codec_destroy(&enc)","AOM_CODEC_OK",(aom_codec_err_t *)&local_3f8,
                   (aom_codec_err_t *)&local_3f0);
        if (local_3e0[0] != (internal)0x0) goto LAB_00624b67;
        testing::Message::Message((Message *)&local_3f8);
        if (local_3d8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_3d8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_api_test.cc"
                   ,0x35d,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_3f8);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    _Var3._M_head_impl = local_3f8._M_head_impl;
  }
  if ((aom_image_t *)_Var3._M_head_impl != (aom_image_t *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
LAB_00624b67:
  if (local_3d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_3d8 != local_3d8 + 2) {
      operator_delete((undefined8 *)*local_3d8);
    }
    operator_delete(local_3d8);
  }
  return;
}

Assistant:

TEST(EncodeAPI, AomediaIssue3509VbrMinSection101Percent) {
  // Initialize libaom encoder.
  aom_codec_iface_t *const iface = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;

  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME),
            AOM_CODEC_OK);

  cfg.g_w = 1920;
  cfg.g_h = 1080;
  cfg.rc_target_bitrate = 1000000;
  // Set this to more than 100 percent to cause an error when vbr_min_bits is
  // cast to `int` in av1_rc_update_framerate() if vbr_min_bits is not clamped
  // to INT_MAX.
  cfg.rc_2pass_vbr_minsection_pct = 101;

  ASSERT_EQ(aom_codec_enc_init(&enc, iface, &cfg, 0), AOM_CODEC_OK);

  // Create input image.
  aom_image_t *const image =
      CreateGrayImage(AOM_IMG_FMT_I420, cfg.g_w, cfg.g_h);
  ASSERT_NE(image, nullptr);

  // Encode frame.
  // `duration` can go as high as 300, but the UBSan error is gone if
  // `duration` is 301 or higher.
  ASSERT_EQ(aom_codec_encode(&enc, image, 0, /*duration=*/300, 0),
            AOM_CODEC_OK);

  // Free resources.
  aom_img_free(image);
  ASSERT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}